

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

MainBuilder * __thiscall
kj::MainBuilder::callAfterParsing
          (MainBuilder *this,Function<kj::MainBuilder::Validity_()> *callback)

{
  bool bVar1;
  Impl *pIVar2;
  Function<kj::MainBuilder::Validity_()> *other;
  Fault local_68;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Fault local_50;
  Fault f;
  undefined1 local_40 [8];
  DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity_()>_>_&,_const_kj::None_&>
  _kjCondition;
  Function<kj::MainBuilder::Validity_()> *callback_local;
  MainBuilder *this_local;
  
  _kjCondition._32_8_ = callback;
  pIVar2 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&pIVar2->finalCallback);
  kj::_::DebugExpression<kj::Maybe<kj::Function<kj::MainBuilder::Validity()>>&>::operator==
            ((DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity_()>_>_&,_const_kj::None_&>
              *)local_40,
             (DebugExpression<kj::Maybe<kj::Function<kj::MainBuilder::Validity()>>&> *)&f,
             (None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity()>>&,kj::None_const&>&,char_const(&)[43]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x179,FAILED,"impl->finalCallback == kj::none",
               "_kjCondition,\"callAfterParsing() can only be called once\"",
               (DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity_()>_>_&,_const_kj::None_&>
                *)local_40,(char (*) [43])"callAfterParsing() can only be called once");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  pIVar2 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  f_1.exception._2_1_ =
       std::
       map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
       ::empty(&pIVar2->subCommands);
  f_1.exception._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&f_1.exception + 3));
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[57]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x17a,FAILED,"impl->subCommands.empty()",
               "_kjCondition,\"cannot have a final callback when accepting sub-commands\"",
               (DebugExpression<bool> *)((long)&f_1.exception + 3),
               (char (*) [57])"cannot have a final callback when accepting sub-commands");
    kj::_::Debug::Fault::fatal(&local_68);
  }
  other = mv<kj::Function<kj::MainBuilder::Validity()>>(callback);
  pIVar2 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  Maybe<kj::Function<kj::MainBuilder::Validity_()>_>::operator=(&pIVar2->finalCallback,other);
  return this;
}

Assistant:

MainBuilder& MainBuilder::callAfterParsing(Function<Validity()> callback) {
  KJ_REQUIRE(impl->finalCallback == kj::none, "callAfterParsing() can only be called once");
  KJ_REQUIRE(impl->subCommands.empty(), "cannot have a final callback when accepting sub-commands");
  impl->finalCallback = kj::mv(callback);
  return *this;
}